

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,PointerType *type)

{
  uint uVar1;
  Type *local_30;
  uint local_24;
  Type *local_20;
  PointerType *local_18;
  PointerType *type_local;
  StreamState *this_local;
  
  local_18 = type;
  type_local = (PointerType *)this;
  uVar1 = Type::getAddressSpace(&type->super_Type);
  if (uVar1 == 0) {
    local_30 = PointerType::getElementType(local_18);
    append<LLVMBC::Type*,char_const(&)[2]>(this,&local_30,(char (*) [2])0x2a8f5a);
  }
  else {
    local_20 = PointerType::getElementType(local_18);
    local_24 = Type::getAddressSpace(&local_18->super_Type);
    append<LLVMBC::Type*,char_const(&)[12],unsigned_int,char_const(&)[3]>
              (this,&local_20,(char (*) [12])" addrspace(",&local_24,(char (*) [3])")*");
  }
  return;
}

Assistant:

void StreamState::append(PointerType *type)
{
	if (type->getAddressSpace() != 0)
		append(type->getElementType(), " addrspace(", type->getAddressSpace(), ")*");
	else
		append(type->getElementType(), "*");
}